

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O0

void __thiscall
trun::TestFunc::ExecuteDependencies
          (TestFunc *this,Ref *dynlib,CBPrePostHook *cbPreHook,CBPrePostHook *cbPostHook)

{
  bool bVar1;
  element_type *peVar2;
  CBPrePostHook local_68 [2];
  undefined1 local_58 [24];
  shared_ptr<trun::TestFunc> *func;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *__range1;
  CBPrePostHook *cbPostHook_local;
  CBPrePostHook *cbPreHook_local;
  Ref *dynlib_local;
  TestFunc *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
           ::begin(&this->dependencies);
  func = (shared_ptr<trun::TestFunc> *)
         std::
         vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
         ::end(&this->dependencies);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                           (&__end1,(__normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                                     *)&func), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_58._16_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
         ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58._16_8_);
    bVar1 = IsIdle(peVar2);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58._16_8_);
      std::shared_ptr<trun::IDynLibrary>::shared_ptr
                ((shared_ptr<trun::IDynLibrary> *)local_68,dynlib);
      Execute((TestFunc *)local_58,(Ref *)peVar2,local_68,cbPreHook);
      std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_58);
      std::shared_ptr<trun::IDynLibrary>::~shared_ptr((shared_ptr<trun::IDynLibrary> *)local_68);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void TestFunc::ExecuteDependencies(IDynLibrary::Ref dynlib, const CBPrePostHook &cbPreHook, const CBPrePostHook &cbPostHook) {
    for (auto &func : dependencies) {
        if (!func->IsIdle()) {
            continue;
        }
        func->Execute(dynlib, cbPreHook, cbPostHook);
    }
}